

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Routines_Disasm.c
# Opt level: O2

void vex_ExGx(PDISASM pMyDisasm)

{
  UInt8 UVar1;
  Int32 IVar2;
  Int32 IVar3;
  Int32 IVar4;
  Int32 IVar5;
  
  verifyVEXvvvv(pMyDisasm);
  UVar1 = (pMyDisasm->Reserved_).VEX.L;
  if (UVar1 == '\0') {
    IVar2 = 9;
    IVar3 = 4;
    IVar4 = 0x110000;
  }
  else {
    if (UVar1 != '\x01') {
      if ((pMyDisasm->Reserved_).EVEX.LL != '\x02') {
        return;
      }
      IVar2 = 0xe;
      IVar3 = 0x10;
      IVar5 = 0x140000;
      goto LAB_00134125;
    }
    IVar2 = 10;
    IVar3 = 8;
    IVar4 = 0x120000;
  }
  IVar5 = 0x140000;
  if ((pMyDisasm->Reserved_).EVEX.state != '\x01') {
    IVar5 = IVar4;
  }
LAB_00134125:
  (pMyDisasm->Instruction).Category = IVar5;
  (pMyDisasm->Reserved_).Register_ = IVar3;
  (pMyDisasm->Reserved_).MemDecoration = IVar2;
  ExGx(pMyDisasm);
  return;
}

Assistant:

void __bea_callspec__ vex_ExGx(PDISASM pMyDisasm)
{
  verifyVEXvvvv(pMyDisasm);
  if (GV.VEX.L == 0) {
    pMyDisasm->Instruction.Category = (GV.EVEX.state == InUsePrefix) ? AVX512_INSTRUCTION : AVX_INSTRUCTION;
    GV.Register_ = SSE_REG;
    GV.MemDecoration = Arg1_m128_xmm;
    ExGx(pMyDisasm);
  }
  else if (GV.VEX.L == 0x1) {
    pMyDisasm->Instruction.Category = (GV.EVEX.state == InUsePrefix) ? AVX512_INSTRUCTION : AVX2_INSTRUCTION;
    GV.Register_ = AVX_REG;
    GV.MemDecoration = Arg1_m256_ymm;
    ExGx(pMyDisasm);
  }
  else if (GV.EVEX.LL == 0x2) {
    pMyDisasm->Instruction.Category = AVX512_INSTRUCTION;
    GV.Register_ = AVX512_REG;
    GV.MemDecoration = Arg1_m512_zmm;
    ExGx(pMyDisasm);
  }
}